

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O0

void TestObject::Visit(Recycler *recycler,TestObject *root)

{
  TestObject *root_local;
  Recycler *recycler_local;
  
  Visit<TestObject::Visit(Memory::Recycler*,TestObject*)::__0>(recycler,root);
  return;
}

Assistant:

void TestObject::Visit(Recycler *recycler, TestObject *root)
{
    Visit(recycler, root, [](TestObject*) { });
}